

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O3

void objclr(mcmcxdef *mctx,objnum objn,prpnum mindel)

{
  ushort *puVar1;
  ushort uVar2;
  uchar *puVar3;
  uint uVar4;
  prpnum *__dest;
  
  puVar3 = mcmlck(mctx,objn);
  uVar2 = *(ushort *)(puVar3 + 2);
  uVar4 = (uint)*(ushort *)(puVar3 + 6);
  if (*(ushort *)(puVar3 + 6) == 0) {
    puVar3[4] = '\0';
    puVar3[5] = '\0';
  }
  else {
    __dest = (prpnum *)(puVar3 + 0xe);
    memmove(__dest,puVar3 + (ulong)*(ushort *)(puVar3 + 4) * 2 + 0xe,
            (size_t)(puVar3 + ((ulong)*(ushort *)(puVar3 + 8) -
                              (long)(puVar3 + (ulong)*(ushort *)(puVar3 + 4) * 2 + 0xe))));
    puVar3[4] = '\0';
    puVar3[5] = '\0';
    do {
      if (*__dest < mindel) {
        __dest = (prpnum *)((long)__dest + (ulong)*(ushort *)((long)__dest + 3) + 6);
      }
      else {
        *(byte *)((long)__dest + 5) = *(byte *)((long)__dest + 5) & 0xfd;
        objdelp(mctx,objn,*__dest,0);
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  puVar1 = (ushort *)
           ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
           (ulong)((mctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(mctx,objn);
  if ((uVar2 & 2) != 0) {
    objindx(mctx,objn);
    return;
  }
  return;
}

Assistant:

void objclr(mcmcxdef *mctx, objnum objn, prpnum mindel)
{
    objdef *o;
    prpdef *p;
    int     cnt;
    prpnum  prop;
    int     indexed;
    
    /* get a lock on the object */
    o = (objdef *)mcmlck(mctx, objn);
    indexed = objflg(o) & OBJFINDEX;
    
    /* delete superclasses - move properties down over former sc array */
    if (objnprop(o))
        memmove(objsc(o), objprp(o),
                (size_t)(((uchar *)o) + objfree(o) - (uchar *)objprp(o)));
    objsnsc(o, 0);                                 /* zero superclasses now */
    
    /* delete non-"system" properties (propnum < mindel) */
    for (p = objprp(o), cnt = objnprop(o) ; cnt ; --cnt)
    {
        if ((prop = prpprop(p)) >= mindel)
        {
            prpflg(p) &= ~PRPFIGN;   /* delete even if it was marked ignore */
            objdelp(mctx, objn, prop, FALSE);  /* remove prpdef from object */
            /* p is left pointing at next prop, as it was moved down */
        }
        else
            p = objpnxt(p);                   /* advance over this property */
    }
    
    /* mark cache object modified and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    if (indexed) objindx(mctx, objn);
}